

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O2

vector<COutPoint,_std::allocator<COutPoint>_> * __thiscall
wallet::CCoinControl::ListSelected
          (vector<COutPoint,_std::allocator<COutPoint>_> *__return_storage_ptr__,CCoinControl *this)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  _Rb_tree_color local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->m_selected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_selected)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    local_38 = p_Var1[2]._M_color;
    local_58._0_8_ = *(undefined8 *)(p_Var1 + 1);
    local_58._8_8_ = p_Var1[1]._M_parent;
    local_48 = p_Var1[1]._M_left;
    p_Stack_40 = p_Var1[1]._M_right;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::emplace_back<COutPoint>
              (__return_storage_ptr__,(COutPoint *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<COutPoint> CCoinControl::ListSelected() const
{
    std::vector<COutPoint> outpoints;
    std::transform(m_selected.begin(), m_selected.end(), std::back_inserter(outpoints),
        [](const std::map<COutPoint, PreselectedInput>::value_type& pair) {
            return pair.first;
        });
    return outpoints;
}